

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

int __kmp_api_omp_in_final_(void)

{
  kmp_info_t *pkVar1;
  uint local_4;
  
  if (__kmp_init_parallel == 0) {
    local_4 = 0;
  }
  else {
    pkVar1 = __kmp_entry_thread();
    local_4 = (uint)((pkVar1->th).th_current_task)->td_flags >> 1 & 1;
  }
  return local_4;
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_IN_FINAL)(void) {
#ifdef KMP_STUB
  return 0; // TO DO: clarify whether it returns 1 or 0?
#else
  if (!TCR_4(__kmp_init_parallel)) {
    return 0;
  }
  return __kmp_entry_thread()->th.th_current_task->td_flags.final;
#endif
}